

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InitTermTest.cpp
# Opt level: O2

int TestInit4DOM(char *xmlFile,bool gDoNamespaces,bool gDoSchema,bool gSchemaFullChecking,
                Teststate theState)

{
  XercesDOMParser *this;
  long lVar1;
  undefined7 in_register_00000031;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  InitTermTestErrorHandler errorHandler;
  
  uVar2 = CONCAT71(in_register_00000031,gDoNamespaces);
  if (theState - Multiple < 4) {
    lVar3 = *(long *)(&DAT_00104468 + (ulong)(theState - Multiple) * 8);
    lVar1 = lVar3;
  }
  else {
    lVar3 = 1;
    lVar1 = lVar3;
  }
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    uVar2 = 0;
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
  }
  if (theState == ExceedLimit) {
    uVar2 = 0;
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
  }
  this = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,uVar2);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  bVar4 = SUB81(this,0);
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar4);
  xercesc_4_0::AbstractDOMParser::setDoSchema(bVar4);
  xercesc_4_0::AbstractDOMParser::setHandleMultipleImports(bVar4);
  xercesc_4_0::AbstractDOMParser::setValidationSchemaFullChecking(bVar4);
  xercesc_4_0::XercesDOMParser::setErrorHandler((ErrorHandler *)this);
  xercesc_4_0::AbstractDOMParser::parse((char *)this);
  (**(code **)(*(long *)this + 8))(this);
  while (bVar4 = lVar1 != 0, lVar1 = lVar1 + -1, bVar4) {
    xercesc_4_0::XMLPlatformUtils::Terminate();
  }
  if ((theState == ExceedLimit) || (theState == UnEven)) {
    xercesc_4_0::XMLPlatformUtils::Terminate();
  }
  return 0;
}

Assistant:

int TestInit4DOM(const char* xmlFile, bool gDoNamespaces, bool gDoSchema, bool gSchemaFullChecking, Teststate theState)
{
    TESTINITPRE;
    XercesDOMParser* parser = new XercesDOMParser;
    parser->setDoNamespaces(gDoNamespaces);
    parser->setDoSchema(gDoSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(gSchemaFullChecking);
    TESTINITPOST;
}